

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::setOption(Context *this,char *option,int value)

{
  char *value_00;
  String local_38;
  int local_1c;
  char *pcStack_18;
  int value_local;
  char *option_local;
  Context *this_local;
  
  local_1c = value;
  pcStack_18 = option;
  option_local = (char *)this;
  doctest::toString(&local_38,value);
  value_00 = String::c_str(&local_38);
  setOption(this,option,value_00);
  String::~String(&local_38);
  return;
}

Assistant:

void Context::setOption(const char* option, int value) {
    setOption(option, toString(value).c_str());
    // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
}